

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::reset_peer_info(raft_server *this)

{
  _List_node_base *p_Var1;
  element_type *peVar2;
  long *plVar3;
  element_type *peVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Node *p_Var7;
  long lVar8;
  undefined4 extraout_var;
  _Atomic_word *this_00;
  ptr<cluster_config> my_next_config;
  ptr<buffer> new_conf_buf;
  ptr<log_entry> entry;
  ptr<srv_config> my_srv_config;
  ptr<cluster_config> c_config;
  log_val_type local_aa;
  undefined1 local_a9;
  ptr<cluster_config> local_a8;
  undefined1 local_98 [40];
  undefined1 local_70 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined1 local_58 [48];
  __atomic_base<unsigned_long> local_28;
  
  get_config((raft_server *)local_58);
  p_Var1 = ((_List_node_base *)(local_58._0_8_ + 0x40))->_M_prev;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar5 = (*peVar2->_vptr_logger[7])();
    if (4 < iVar5) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_98,"servers: %zu\n",p_Var1);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"reset_peer_info",0x2ed,local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
    }
  }
  if ((_List_node_base *)0x1 < p_Var1) {
    cluster_config::get_server((cluster_config *)(local_70 + 8),(int)local_58._0_8_);
    if (local_70._8_8_ == 0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar5 = (*peVar2->_vptr_logger[7])();
        if (2 < iVar5) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)local_98,"my_srv_config is NULL");
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"reset_peer_info",0x2f4,local_98);
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_);
          }
        }
      }
    }
    else {
      local_58._16_8_ = *(_List_node_base **)local_58._0_8_;
      local_58._24_8_ = *(_List_node_base **)(local_58._0_8_ + 8);
      local_a8.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var6->_M_use_count = 1;
      p_Var6->_M_weak_count = 1;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0061e940;
      local_a8.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var6 + 1);
      p_Var6[1]._vptr__Sp_counted_base = (_func_int **)local_58._16_8_;
      p_Var6[1]._M_use_count = local_58._24_4_;
      p_Var6[1]._M_weak_count = local_58._28_4_;
      *(undefined1 *)&p_Var6[2]._vptr__Sp_counted_base = 0;
      *(_Atomic_word **)&p_Var6[2]._M_use_count = &p_Var6[3]._M_use_count;
      p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(undefined1 *)&p_Var6[3]._M_use_count = 0;
      this_00 = &p_Var6[4]._M_use_count;
      p_Var6[4]._M_use_count = 0;
      p_Var6[4]._M_weak_count = 0;
      p_Var6[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var6[5]._vptr__Sp_counted_base = (_func_int **)this_00;
      *(_Atomic_word **)&p_Var6[4]._M_use_count = this_00;
      p_Var6[5]._M_use_count = 0;
      p_Var6[5]._M_weak_count = 0;
      local_a8.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var6;
      p_Var7 = std::__cxx11::
               list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
               ::_M_create_node<std::shared_ptr<nuraft::srv_config>const&>
                         ((list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                           *)this_00,(shared_ptr<nuraft::srv_config> *)(local_70 + 8));
      std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
      peVar4 = local_a8.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      *(long *)&p_Var6[5]._M_use_count = *(long *)&p_Var6[5]._M_use_count + 1;
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,((_List_node_base *)(local_58._0_8_ + 0x10))->_M_prev,
                 (code *)((long)&((_List_node_base *)(local_58._0_8_ + 0x20))->_M_next->_M_next +
                         (long)((_List_node_base *)(local_58._0_8_ + 0x10))->_M_prev));
      std::__cxx11::string::_M_assign((string *)&peVar4->user_ctx_);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
      (local_a8.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      async_replication_ = *(bool *)&((_List_node_base *)(local_58._0_8_ + 0x10))->_M_next;
      set_config(this,&local_a8);
      plVar3 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar3 + 0x18))
                (plVar3,local_a8.
                        super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      cluster_config::serialize((cluster_config *)local_98);
      local_28._M_i =
           (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->term_).super___atomic_base<unsigned_long>._M_i;
      local_aa = conf;
      lVar8 = std::chrono::_V2::system_clock::now();
      local_58._40_8_ = lVar8 / 1000;
      local_98._32_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_70,
                 (log_entry **)(local_98 + 0x20),(allocator<nuraft::log_entry> *)&local_a9,
                 &local_28._M_i,(shared_ptr<nuraft::buffer> *)local_98,&local_aa,
                 (unsigned_long *)(local_58 + 0x28));
      iVar5 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      store_log_entry(this,(ptr<log_entry> *)(local_98 + 0x20),CONCAT44(extraout_var,iVar5) - 1);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      if (local_a8.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
  }
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return;
}

Assistant:

void raft_server::reset_peer_info() {
    ptr<cluster_config> c_config = get_config();
    auto const srv_cnt = c_config->get_servers().size();
    p_db("servers: %zu\n", srv_cnt);
    if (srv_cnt > 1) {
        ptr<srv_config> my_srv_config = c_config->get_server(id_);
        if (!my_srv_config) {
            // It means that this node was removed, and then
            // added again (it shouldn't happen though).
            // Just return.
            p_wn("my_srv_config is NULL");
            return;
        }

        ptr<cluster_config> my_next_config = cs_new<cluster_config>
            ( c_config->get_log_idx(), c_config->get_prev_log_idx() );
        my_next_config->get_servers().push_back(my_srv_config);
        my_next_config->set_user_ctx( c_config->get_user_ctx() );
        my_next_config->set_async_replication
                        ( c_config->is_async_replication() );

        set_config(my_next_config);
        ctx_->state_mgr_->save_config(*my_next_config);

        // Make its local temporary log for configuration.
        // It will be rolled back and overwritten if this node
        // re-joins the cluster.
        ptr<buffer> new_conf_buf(my_next_config->serialize());
        ptr<log_entry> entry(cs_new<log_entry>(
            state_->get_term(), new_conf_buf, log_val_type::conf,
            timer_helper::get_timeofday_us()));
        store_log_entry(entry, log_store_->next_slot()-1);
    }
}